

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O1

int notation4(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  code *pcVar1;
  int iVar2;
  
  if (tok == 0xf) {
    return 0;
  }
  if (tok == 0x1b) {
    iVar2 = 0x10;
    pcVar1 = declClose;
  }
  else if (tok == 0x11) {
    pcVar1 = internalSubset;
    if (state->documentEntity == 0) {
      pcVar1 = externalSubset1;
    }
    iVar2 = 0x11;
  }
  else {
    iVar2 = -1;
    pcVar1 = error;
    if ((tok == 0x1c) && (state->documentEntity == 0)) {
      return 0x34;
    }
  }
  state->handler = pcVar1;
  return iVar2;
}

Assistant:

static
int notation4(PROLOG_STATE *state,
              int tok,
              const char *ptr,
              const char *end,
              const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_LITERAL:
    state->handler = declClose;
    return XML_ROLE_NOTATION_SYSTEM_ID;
  case XML_TOK_DECL_CLOSE:
    setTopLevel(state);
    return XML_ROLE_NOTATION_NO_SYSTEM_ID;
  }
  return common(state, tok);
}